

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

wchar_t process_extra(archive_read *a,archive_entry *entry,char *p,size_t extra_length,
                     zip_entry *zip_entry)

{
  byte bVar1;
  ushort uVar2;
  void *pvVar3;
  code *pcVar4;
  uint uVar5;
  size_t sVar6;
  archive_string_conv *paVar8;
  size_t sVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  char *pcVar14;
  uint uVar15;
  ushort uVar16;
  ulong uVar7;
  
  if (extra_length != 0) {
    if (extra_length < 4) {
      sVar6 = 0;
      do {
        if (p[sVar6] != '\0') {
          archive_set_error(&a->archive,0x54,
                            "Too-small extra data: Need at least 4 bytes, but only found %d bytes",
                            extra_length & 0xffffffff);
          return L'\xffffffe7';
        }
        sVar6 = sVar6 + 1;
      } while (extra_length != sVar6);
    }
    else {
      pvVar3 = a->format->data;
      uVar10 = 0;
      uVar12 = 0;
      do {
        uVar16 = *(ushort *)(p + uVar10 + 2);
        uVar15 = (uint)uVar16;
        uVar5 = uVar12 + 4;
        uVar7 = (ulong)uVar5;
        if (extra_length < uVar12 + 4 + uVar15) {
          archive_set_error(&a->archive,0x54,
                            "Extra data overflow: Need %d bytes but only found %d bytes",
                            (ulong)uVar15,(ulong)((int)extra_length - uVar5));
          return L'\xffffffe7';
        }
        uVar2 = *(ushort *)(p + uVar10);
        uVar11 = uVar15;
        if (uVar2 < 0x7075) {
          if (uVar2 < 0x5855) {
            if (uVar2 == 1) {
              zip_entry->flags = zip_entry->flags | 1;
              if (zip_entry->uncompressed_size == 0xffffffff) {
                if ((uVar16 < 8) || ((long)((ulong)*(uint *)(p + uVar7 + 4) << 0x20) < 0)) {
                  pcVar14 = "Malformed 64-bit uncompressed size";
                  goto LAB_0013b5e6;
                }
                zip_entry->uncompressed_size =
                     CONCAT44(*(uint *)(p + uVar7 + 4),*(undefined4 *)(p + uVar7));
                uVar15 = uVar15 - 8;
                uVar7 = (ulong)(uVar12 + 0xc);
              }
              if (zip_entry->compressed_size == 0xffffffff) {
                if (7 < (ushort)uVar15) {
                  if (-1 < (long)((ulong)*(uint *)(p + uVar7 + 4) << 0x20)) {
                    zip_entry->compressed_size =
                         CONCAT44(*(uint *)(p + uVar7 + 4),*(undefined4 *)(p + uVar7));
                    uVar7 = (ulong)((int)uVar7 + 8);
                    uVar15 = uVar15 - 8;
                    goto LAB_0013b246;
                  }
                }
                pcVar14 = "Malformed 64-bit compressed size";
LAB_0013b5e6:
                archive_set_error(&a->archive,0x54,pcVar14);
                return L'\xffffffe7';
              }
LAB_0013b246:
              uVar5 = (uint)uVar7;
              uVar11 = uVar15;
              if (zip_entry->local_header_offset == 0xffffffff) {
                if (((ushort)uVar15 < 8) || ((long)((ulong)*(uint *)(p + uVar7 + 4) << 0x20) < 0)) {
                  pcVar14 = "Malformed 64-bit local header offset";
                  goto LAB_0013b5e6;
                }
                zip_entry->local_header_offset =
                     CONCAT44(*(uint *)(p + uVar7 + 4),*(undefined4 *)(p + uVar7));
                uVar5 = uVar5 + 8;
                uVar11 = uVar15 - 8;
              }
            }
            else if (uVar2 == 0x5455) {
              if (uVar16 == 0) {
                pcVar14 = "Incomplete extended time field";
                goto LAB_0013b5e6;
              }
              bVar1 = p[uVar7];
              uVar5 = uVar12 + 5;
              uVar11 = uVar15 - 1;
              if ((bVar1 & 1) != 0) {
                if (uVar16 < 5) goto LAB_0013b3b6;
                zip_entry->mtime = (ulong)*(uint *)(p + uVar5);
                uVar5 = uVar12 + 9;
                uVar11 = uVar15 - 5;
              }
              uVar10 = (ulong)uVar5;
              if ((bVar1 & 2) != 0) {
                if ((ushort)uVar11 < 4) goto LAB_0013b3b6;
                zip_entry->atime = (ulong)*(uint *)(p + uVar10);
                uVar10 = (ulong)(uVar5 + 4);
                uVar11 = uVar11 - 4;
              }
              uVar5 = (uint)uVar10;
              if (((bVar1 & 4) != 0) && (3 < (ushort)uVar11)) {
                zip_entry->ctime = (ulong)*(uint *)(p + uVar10);
                uVar5 = uVar5 + 4;
                uVar11 = uVar11 - 4;
              }
            }
          }
          else if (uVar2 == 0x5855) {
            if (7 < uVar16) {
              zip_entry->atime = (ulong)*(uint *)(p + uVar7);
              zip_entry->mtime = (ulong)*(uint *)(p + uVar7 + 4);
              if (0xb < uVar16) {
                zip_entry->uid = (ulong)*(ushort *)(p + uVar7 + 8);
                zip_entry->gid = (ulong)*(ushort *)(p + uVar7 + 10);
              }
            }
          }
          else if (uVar2 == 0x6c78) {
            if (uVar16 == 0) goto LAB_0013b3b1;
            bVar1 = p[uVar7];
            uVar5 = uVar12 + 5;
            uVar11 = uVar15 - 1;
            if (((char)bVar1 < '\0') && ((short)uVar11 != 0)) {
              do {
                uVar15 = uVar11;
                uVar10 = (ulong)uVar5;
                uVar5 = uVar5 + 1;
                uVar11 = uVar15 - 1;
                if (-1 < p[uVar10]) break;
              } while ((short)uVar15 != 1);
            }
            if ((bVar1 & 1) != 0) {
              if ((ushort)uVar15 < 3) goto LAB_0013b3b6;
              zip_entry->system = p[(ulong)uVar5 + 1];
              uVar5 = uVar5 + 2;
              uVar11 = uVar15 - 3;
            }
            if ((bVar1 & 2) != 0) {
              if ((ushort)uVar11 < 2) goto LAB_0013b3b6;
              uVar5 = uVar5 + 2;
              uVar11 = uVar11 - 2;
            }
            if ((bVar1 & 4) != 0) {
              if ((ushort)uVar11 < 4) goto LAB_0013b3b6;
              uVar12 = *(uint *)(p + uVar5);
              if (zip_entry->system == '\0') {
                uVar16 = 0x41fd;
                if ((uVar12 & 0x10) == 0) {
                  uVar16 = 0x81b4;
                }
                zip_entry->mode = uVar16;
                if ((uVar12 & 1) != 0) {
                  uVar16 = uVar16 & 0x16d;
                  goto LAB_0013b541;
                }
              }
              else {
                if (zip_entry->system == '\x03') {
                  uVar16 = (ushort)(uVar12 >> 0x10);
                }
                else {
                  uVar16 = 0;
                }
LAB_0013b541:
                zip_entry->mode = uVar16;
              }
              uVar5 = uVar5 + 4;
              uVar11 = uVar11 - 4;
            }
            if (((bVar1 & 8) != 0) && (1 < (ushort)uVar11)) {
              uVar16 = *(ushort *)(p + uVar5);
              uVar5 = uVar5 + 2;
              uVar11 = uVar11 - 2;
              if (uVar16 <= (ushort)uVar11) {
                uVar5 = uVar5 + uVar16;
                uVar11 = uVar11 - uVar16;
              }
            }
          }
        }
        else if (uVar2 < 0x7875) {
          if (uVar2 == 0x7075) {
            if ((entry != (archive_entry *)0x0) && (4 < uVar16)) {
              uVar5 = uVar12 + 9;
              uVar11 = uVar15 - 5;
              if (*(long *)((long)pvVar3 + 0x1ee0) == 0) {
                paVar8 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
                *(archive_string_conv **)((long)pvVar3 + 0x1ee0) = paVar8;
                if (paVar8 == (archive_string_conv *)0x0) goto LAB_0013b3b6;
              }
              if ((*(char *)((long)pvVar3 + 0xa0) == '\0') &&
                 (pcVar14 = archive_entry_pathname(entry), pcVar14 != (char *)0x0)) {
                pcVar4 = *(code **)((long)pvVar3 + 0x98);
                sVar9 = strlen(pcVar14);
                uVar10 = (*pcVar4)(0,pcVar14,sVar9);
                if (uVar10 != *(uint *)(p + ((ulong)uVar5 - 4))) goto LAB_0013b3b6;
              }
              _archive_entry_copy_pathname_l
                        (entry,p + uVar5,(ulong)(uVar11 & 0xffff),
                         *(archive_string_conv **)((long)pvVar3 + 0x1ee0));
            }
          }
          else if (((uVar2 == 0x7855) && (1 < uVar16)) &&
                  (zip_entry->uid = (ulong)*(ushort *)(p + uVar7), 3 < uVar16)) {
            uVar10 = (ulong)*(ushort *)(p + uVar7 + 2);
            goto LAB_0013b0e1;
          }
        }
        else if (uVar2 == 0x7875) {
          if (uVar16 == 0) {
LAB_0013b3b1:
            uVar11 = 0;
          }
          else if (p[uVar7] == '\x01') {
            uVar13 = 0;
            if (3 < uVar16) {
              uVar13 = (uint)(byte)p[uVar12 + 5];
              if (uVar13 == 2) {
                uVar10 = (ulong)*(ushort *)(p + uVar7 + 2);
                uVar13 = 2;
              }
              else {
                if ((uVar16 < 6) || (p[uVar12 + 5] != 4)) goto LAB_0013b4cd;
                uVar10 = (ulong)*(uint *)(p + uVar7 + 2);
                uVar13 = 4;
              }
              zip_entry->uid = uVar10;
            }
LAB_0013b4cd:
            if (uVar13 + 5 <= uVar15) {
              if (p[uVar13 + uVar12 + 6] == '\x04') {
                if (uVar13 + 7 <= uVar15) {
                  uVar10 = (ulong)*(uint *)(p + (ulong)uVar13 + uVar7 + 3);
                  goto LAB_0013b0e1;
                }
              }
              else if (p[uVar13 + uVar12 + 6] == '\x02') {
                uVar10 = (ulong)*(ushort *)(p + (ulong)uVar13 + uVar7 + 3);
LAB_0013b0e1:
                zip_entry->gid = uVar10;
              }
            }
          }
        }
        else if (uVar2 == 0x9901) {
          if (uVar16 < 6) {
            pcVar14 = "Incomplete AES field";
            goto LAB_0013b5e6;
          }
          if ((p[uVar12 + 6] == 'A') && (p[uVar12 + 7] == 'E')) {
            (zip_entry->aes_extra).vendor = (uint)*(ushort *)(p + uVar7);
            (zip_entry->aes_extra).strength = (int)p[uVar12 + 8];
            (zip_entry->aes_extra).compression = p[uVar12 + 9];
          }
        }
LAB_0013b3b6:
        uVar12 = (uVar11 & 0xffff) + uVar5;
        uVar10 = (ulong)uVar12;
      } while (uVar10 <= extra_length - 4);
    }
  }
  return L'\0';
}

Assistant:

static int
process_extra(struct archive_read *a, struct archive_entry *entry,
     const char *p, size_t extra_length, struct zip_entry* zip_entry)
{
	unsigned offset = 0;
	struct zip *zip = (struct zip *)(a->format->data);

	if (extra_length == 0) {
		return ARCHIVE_OK;
	}

	if (extra_length < 4) {
		size_t i = 0;
		/* Some ZIP files may have trailing 0 bytes. Let's check they
		 * are all 0 and ignore them instead of returning an error.
		 *
		 * This is not technically correct, but some ZIP files look
		 * like this and other tools support those files - so let's
		 * also  support them.
		 */
		for (; i < extra_length; i++) {
			if (p[i] != 0) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Too-small extra data: "
				    "Need at least 4 bytes, "
				    "but only found %d bytes",
				    (int)extra_length);
				return ARCHIVE_FAILED;
			}
		}

		return ARCHIVE_OK;
	}

	while (offset <= extra_length - 4) {
		unsigned short headerid = archive_le16dec(p + offset);
		unsigned short datasize = archive_le16dec(p + offset + 2);

		offset += 4;
		if (offset + datasize > extra_length) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT, "Extra data overflow: "
			    "Need %d bytes but only found %d bytes",
			    (int)datasize, (int)(extra_length - offset));
			return ARCHIVE_FAILED;
		}
#ifdef DEBUG
		fprintf(stderr, "Header id 0x%04x, length %d\n",
		    headerid, datasize);
#endif
		switch (headerid) {
		case 0x0001:
			/* Zip64 extended information extra field. */
			zip_entry->flags |= LA_USED_ZIP64;
			if (zip_entry->uncompressed_size == 0xffffffff) {
				uint64_t t = 0;
				if (datasize < 8
				    || (t = archive_le64dec(p + offset)) >
				    INT64_MAX) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_FILE_FORMAT,
					    "Malformed 64-bit "
					    "uncompressed size");
					return ARCHIVE_FAILED;
				}
				zip_entry->uncompressed_size = t;
				offset += 8;
				datasize -= 8;
			}
			if (zip_entry->compressed_size == 0xffffffff) {
				uint64_t t = 0;
				if (datasize < 8
				    || (t = archive_le64dec(p + offset)) >
				    INT64_MAX) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_FILE_FORMAT,
					    "Malformed 64-bit "
					    "compressed size");
					return ARCHIVE_FAILED;
				}
				zip_entry->compressed_size = t;
				offset += 8;
				datasize -= 8;
			}
			if (zip_entry->local_header_offset == 0xffffffff) {
				uint64_t t = 0;
				if (datasize < 8
				    || (t = archive_le64dec(p + offset)) >
				    INT64_MAX) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_FILE_FORMAT,
					    "Malformed 64-bit "
					    "local header offset");
					return ARCHIVE_FAILED;
				}
				zip_entry->local_header_offset = t;
				offset += 8;
				datasize -= 8;
			}
			/* archive_le32dec(p + offset) gives disk
			 * on which file starts, but we don't handle
			 * multi-volume Zip files. */
			break;
#ifdef DEBUG
		case 0x0017:
		{
			/* Strong encryption field. */
			if (archive_le16dec(p + offset) == 2) {
				unsigned algId =
					archive_le16dec(p + offset + 2);
				unsigned bitLen =
					archive_le16dec(p + offset + 4);
				int	 flags =
					archive_le16dec(p + offset + 6);
				fprintf(stderr, "algId=0x%04x, bitLen=%u, "
				    "flgas=%d\n", algId, bitLen,flags);
			}
			break;
		}
#endif
		case 0x5455:
		{
			/* Extended time field "UT". */
			int flags;
			if (datasize == 0) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Incomplete extended time field");
				return ARCHIVE_FAILED;
			}
			flags = p[offset];
			offset++;
			datasize--;
			/* Flag bits indicate which dates are present. */
			if (flags & 0x01)
			{
#ifdef DEBUG
				fprintf(stderr, "mtime: %lld -> %d\n",
				    (long long)zip_entry->mtime,
				    archive_le32dec(p + offset));
#endif
				if (datasize < 4)
					break;
				zip_entry->mtime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			if (flags & 0x02)
			{
				if (datasize < 4)
					break;
				zip_entry->atime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			if (flags & 0x04)
			{
				if (datasize < 4)
					break;
				zip_entry->ctime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			break;
		}
		case 0x5855:
		{
			/* Info-ZIP Unix Extra Field (old version) "UX". */
			if (datasize >= 8) {
				zip_entry->atime = archive_le32dec(p + offset);
				zip_entry->mtime =
				    archive_le32dec(p + offset + 4);
			}
			if (datasize >= 12) {
				zip_entry->uid =
				    archive_le16dec(p + offset + 8);
				zip_entry->gid =
				    archive_le16dec(p + offset + 10);
			}
			break;
		}
		case 0x6c78:
		{
			/* Experimental 'xl' field */
			/*
			 * Introduced Dec 2013 to provide a way to
			 * include external file attributes (and other
			 * fields that ordinarily appear only in
			 * central directory) in local file header.
			 * This provides file type and permission
			 * information necessary to support full
			 * streaming extraction.  Currently being
			 * discussed with other Zip developers
			 * ... subject to change.
			 *
			 * Format:
			 *  The field starts with a bitmap that specifies
			 *  which additional fields are included.  The
			 *  bitmap is variable length and can be extended in
			 *  the future.
			 *
			 *  n bytes - feature bitmap: first byte has low-order
			 *    7 bits.  If high-order bit is set, a subsequent
			 *    byte holds the next 7 bits, etc.
			 *
			 *  if bitmap & 1, 2 byte "version made by"
			 *  if bitmap & 2, 2 byte "internal file attributes"
			 *  if bitmap & 4, 4 byte "external file attributes"
			 *  if bitmap & 8, 2 byte comment length + n byte
			 *  comment
			 */
			int bitmap, bitmap_last;

			if (datasize < 1)
				break;
			bitmap_last = bitmap = 0xff & p[offset];
			offset += 1;
			datasize -= 1;

			/* We only support first 7 bits of bitmap; skip rest. */
			while ((bitmap_last & 0x80) != 0
			    && datasize >= 1) {
				bitmap_last = p[offset];
				offset += 1;
				datasize -= 1;
			}

			if (bitmap & 1) {
				/* 2 byte "version made by" */
				if (datasize < 2)
					break;
				zip_entry->system
				    = archive_le16dec(p + offset) >> 8;
				offset += 2;
				datasize -= 2;
			}
			if (bitmap & 2) {
				/* 2 byte "internal file attributes" */
				uint32_t internal_attributes;
				if (datasize < 2)
					break;
				internal_attributes
				    = archive_le16dec(p + offset);
				/* Not used by libarchive at present. */
				(void)internal_attributes; /* UNUSED */
				offset += 2;
				datasize -= 2;
			}
			if (bitmap & 4) {
				/* 4 byte "external file attributes" */
				uint32_t external_attributes;
				if (datasize < 4)
					break;
				external_attributes
				    = archive_le32dec(p + offset);
				if (zip_entry->system == 3) {
					zip_entry->mode
					    = external_attributes >> 16;
				} else if (zip_entry->system == 0) {
					// Interpret MSDOS directory bit
					if (0x10 == (external_attributes &
					    0x10)) {
						zip_entry->mode =
						    AE_IFDIR | 0775;
					} else {
						zip_entry->mode =
						    AE_IFREG | 0664;
					}
					if (0x01 == (external_attributes &
					    0x01)) {
						/* Read-only bit;
						 * strip write permissions */
						zip_entry->mode &= 0555;
					}
				} else {
					zip_entry->mode = 0;
				}
				offset += 4;
				datasize -= 4;
			}
			if (bitmap & 8) {
				/* 2 byte comment length + comment */
				uint32_t comment_length;
				if (datasize < 2)
					break;
				comment_length
				    = archive_le16dec(p + offset);
				offset += 2;
				datasize -= 2;

				if (datasize < comment_length)
					break;
				/* Comment is not supported by libarchive */
				offset += comment_length;
				datasize -= comment_length;
			}
			break;
		}
		case 0x7075:
		{
			/* Info-ZIP Unicode Path Extra Field. */
			if (datasize < 5 || entry == NULL)
				break;
			offset += 5;
			datasize -= 5;

			/* The path name in this field is always encoded
			 * in UTF-8. */
			if (zip->sconv_utf8 == NULL) {
				zip->sconv_utf8 =
					archive_string_conversion_from_charset(
					&a->archive, "UTF-8", 1);
				/* If the converter from UTF-8 is not
				 * available, then the path name from the main
				 * field will more likely be correct. */
				if (zip->sconv_utf8 == NULL)
					break;
			}

			/* Make sure the CRC32 of the filename matches. */
			if (!zip->ignore_crc32) {
				const char *cp = archive_entry_pathname(entry);
				if (cp) {
					unsigned long file_crc =
					    zip->crc32func(0, cp, strlen(cp));
					unsigned long utf_crc =
					    archive_le32dec(p + offset - 4);
					if (file_crc != utf_crc) {
#ifdef DEBUG
						fprintf(stderr,
						    "CRC filename mismatch; "
						    "CDE is %lx, but UTF8 "
						    "is outdated with %lx\n",
						    file_crc, utf_crc);
#endif
						break;
					}
				}
			}

			if (archive_entry_copy_pathname_l(entry,
			    p + offset, datasize, zip->sconv_utf8) != 0) {
				/* Ignore the error, and fallback to the path
				 * name from the main field. */
#ifdef DEBUG
				fprintf(stderr, "Failed to read the ZIP "
				    "0x7075 extra field path.\n");
#endif
			}
			break;
		}
		case 0x7855:
			/* Info-ZIP Unix Extra Field (type 2) "Ux". */
#ifdef DEBUG
			fprintf(stderr, "uid %d gid %d\n",
			    archive_le16dec(p + offset),
			    archive_le16dec(p + offset + 2));
#endif
			if (datasize >= 2)
				zip_entry->uid = archive_le16dec(p + offset);
			if (datasize >= 4)
				zip_entry->gid =
				    archive_le16dec(p + offset + 2);
			break;
		case 0x7875:
		{
			/* Info-Zip Unix Extra Field (type 3) "ux". */
			int uidsize = 0, gidsize = 0;

			/* TODO: support arbitrary uidsize/gidsize. */
			if (datasize >= 1 && p[offset] == 1) {/* version=1 */
				if (datasize >= 4) {
					/* get a uid size. */
					uidsize = 0xff & (int)p[offset+1];
					if (uidsize == 2)
						zip_entry->uid =
						    archive_le16dec(
						        p + offset + 2);
					else if (uidsize == 4 && datasize >= 6)
						zip_entry->uid =
						    archive_le32dec(
						        p + offset + 2);
				}
				if (datasize >= (2 + uidsize + 3)) {
					/* get a gid size. */
					gidsize = 0xff &
					    (int)p[offset+2+uidsize];
					if (gidsize == 2)
						zip_entry->gid =
						    archive_le16dec(
						        p+offset+2+uidsize+1);
					else if (gidsize == 4 &&
					    datasize >= (2 + uidsize + 5))
						zip_entry->gid =
						    archive_le32dec(
						        p+offset+2+uidsize+1);
				}
			}
			break;
		}
		case 0x9901:
			/* WinZip AES extra data field. */
			if (datasize < 6) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Incomplete AES field");
				return ARCHIVE_FAILED;
			}
			if (p[offset + 2] == 'A' && p[offset + 3] == 'E') {
				/* Vendor version. */
				zip_entry->aes_extra.vendor =
				    archive_le16dec(p + offset);
				/* AES encryption strength. */
				zip_entry->aes_extra.strength = p[offset + 4];
				/* Actual compression method. */
				zip_entry->aes_extra.compression =
				    p[offset + 5];
			}
			break;
		default:
			break;
		}
		offset += datasize;
	}
	return ARCHIVE_OK;
}